

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O3

string * __thiscall
wabt::(anonymous_namespace)::CWriter::DefineGlobalScopeName_abi_cxx11_
          (string *__return_storage_ptr__,CWriter *this,ModuleFieldType type,string_view name)

{
  string *extraout_RAX;
  string *psVar1;
  undefined4 in_register_00000014;
  char *pcVar2;
  string *unique;
  string_view sVar3;
  string_view proposed_name;
  string_view wasm_name;
  string *in_stack_ffffffffffffff98;
  string local_50;
  
  sVar3._M_str._4_4_ = in_register_00000014;
  sVar3._M_str._0_4_ = type;
  wasm_name._M_len = name._M_str;
  if ((int)type < 0x7f) {
    sVar3._M_len = (size_t)wasm_name._M_len;
    pcVar2 = wasm_name._M_len;
    sVar3 = anon_unknown_0::StripLeadingDollar((anon_unknown_0 *)name._M_len,sVar3);
    ExportName_abi_cxx11_(&local_50,this,sVar3);
    proposed_name._M_str = pcVar2;
    proposed_name._M_len = (size_t)local_50._M_dataplus._M_p;
    anon_unknown_0::CWriter::FindUniqueName
              (__return_storage_ptr__,(CWriter *)(this + 0x158),
               (SymbolSet *)local_50._M_string_length,proposed_name);
    wasm_name._M_str = (char *)__return_storage_ptr__;
    anon_unknown_0::CWriter::ClaimName
              ((CWriter *)(this + 0x158),(SymbolSet *)(this + 0x98),
               (SymbolMap *)(ulong)(uint)(int)(char)((char)type + 'a'),(char)name._M_len,wasm_name,
               in_stack_ffffffffffffff98);
    psVar1 = (string *)&local_50.field_2;
    if ((string *)local_50._M_dataplus._M_p != psVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      psVar1 = extraout_RAX;
    }
    return psVar1;
  }
  __assert_fail("static_cast<std::underlying_type<ModuleFieldType>::type>(type) < std::numeric_limits<char>::max()"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                ,0x2a3,
                "static char wabt::(anonymous namespace)::CWriter::MangleField(ModuleFieldType)");
}

Assistant:

constexpr char CWriter::MangleField(ModuleFieldType type) {
  assert(static_cast<std::underlying_type<ModuleFieldType>::type>(type) <
         std::numeric_limits<char>::max());
  return 'a' + static_cast<char>(type);
}